

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::AddLinkLibrary
          (cmTarget *this,cmMakefile *mf,string *lib,string *libRef,cmTargetLinkLibraryType llt)

{
  string *this_00;
  bool bVar1;
  __type _Var2;
  TargetType TVar3;
  PolicyStatus PVar4;
  cmTarget *this_01;
  char *pcVar5;
  size_type sVar6;
  byte local_101;
  char *old_val;
  string dependencies;
  string targetEntry;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  string libName;
  bool isNonImportedTarget;
  cmTarget *tgt;
  string *psStack_28;
  cmTargetLinkLibraryType llt_local;
  string *libRef_local;
  string *lib_local;
  cmMakefile *mf_local;
  cmTarget *this_local;
  
  tgt._4_4_ = llt;
  psStack_28 = libRef;
  libRef_local = lib;
  lib_local = (string *)mf;
  mf_local = (cmMakefile *)this;
  this_01 = cmMakefile::FindTargetToUse(mf,lib,false);
  local_101 = 0;
  if (this_01 != (cmTarget *)0x0) {
    bVar1 = IsImported(this_01);
    local_101 = bVar1 ^ 0xff;
  }
  libName.field_2._M_local_buf[0xf] = local_101 & 1;
  if ((libName.field_2._M_local_buf[0xf] == 0) || (tgt._4_4_ == GENERAL_LibraryType)) {
    std::__cxx11::string::string((string *)local_60,(string *)psStack_28);
  }
  else {
    targetNameGenex((string *)local_60,psStack_28);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"LINK_LIBRARIES",&local_81)
  ;
  GetDebugGeneratorExpressions
            ((string *)((long)&targetEntry.field_2 + 8),this,(string *)local_60,tgt._4_4_);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  AppendProperty(this,&local_80,pcVar5,false);
  std::__cxx11::string::~string((string *)(targetEntry.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)local_60);
  sVar6 = cmGeneratorExpression::Find(libRef_local);
  if (((((sVar6 == 0xffffffffffffffff) && (bVar1 = std::operator!=(libRef_local,psStack_28), !bVar1)
        ) && ((this_01 == (cmTarget *)0x0 ||
              ((TVar3 = GetType(this_01), TVar3 != INTERFACE_LIBRARY &&
               (TVar3 = GetType(this_01), TVar3 != OBJECT_LIBRARY)))))) &&
      (_Var2 = std::operator==(&this->Name,libRef_local), !_Var2)) &&
     (((std::
        vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
        ::emplace_back<std::__cxx11::string_const&,cmTargetLinkLibraryType&>
                  ((vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
                    *)&this->OriginalLinkLibraries,libRef_local,
                   (cmTargetLinkLibraryType *)((long)&tgt + 4)), 0 < (int)this->TargetTypeValue &&
       ((int)this->TargetTypeValue < 4)) &&
      ((PVar4 = GetPolicyStatusCMP0073(this), PVar4 == OLD ||
       (PVar4 = GetPolicyStatusCMP0073(this), PVar4 == WARN)))))) {
    std::__cxx11::string::string
              ((string *)(dependencies.field_2._M_local_buf + 8),(string *)&this->Name);
    std::__cxx11::string::operator+=
              ((string *)(dependencies.field_2._M_local_buf + 8),"_LIB_DEPENDS");
    std::__cxx11::string::string((string *)&old_val);
    pcVar5 = cmMakefile::GetDefinition
                       ((cmMakefile *)lib_local,(string *)((long)&dependencies.field_2 + 8));
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)&old_val,pcVar5);
    }
    if (tgt._4_4_ == GENERAL_LibraryType) {
      std::__cxx11::string::operator+=((string *)&old_val,"general");
    }
    else if (tgt._4_4_ == DEBUG_LibraryType) {
      std::__cxx11::string::operator+=((string *)&old_val,"debug");
    }
    else if (tgt._4_4_ == OPTIMIZED_LibraryType) {
      std::__cxx11::string::operator+=((string *)&old_val,"optimized");
    }
    std::__cxx11::string::operator+=((string *)&old_val,";");
    std::__cxx11::string::operator+=((string *)&old_val,(string *)libRef_local);
    std::__cxx11::string::operator+=((string *)&old_val,";");
    this_00 = lib_local;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition
              ((cmMakefile *)this_00,(string *)((long)&dependencies.field_2 + 8),pcVar5,
               "Dependencies for the target",STATIC,false);
    std::__cxx11::string::~string((string *)&old_val);
    std::__cxx11::string::~string((string *)(dependencies.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf, std::string const& lib,
                              std::string const& libRef,
                              cmTargetLinkLibraryType llt)
{
  cmTarget* tgt = mf.FindTargetToUse(lib);
  {
    const bool isNonImportedTarget = tgt && !tgt->IsImported();

    const std::string libName =
      (isNonImportedTarget && llt != GENERAL_LibraryType)
      ? targetNameGenex(libRef)
      : libRef;
    this->AppendProperty(
      "LINK_LIBRARIES",
      this->GetDebugGeneratorExpressions(libName, llt).c_str());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos || lib != libRef ||
      (tgt &&
       (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        tgt->GetType() == cmStateEnums::OBJECT_LIBRARY)) ||
      (this->Name == lib)) {
    return;
  }

  this->OriginalLinkLibraries.emplace_back(lib, llt);

  // Add the explicit dependency information for libraries. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if (this->TargetTypeValue >= cmStateEnums::STATIC_LIBRARY &&
      this->TargetTypeValue <= cmStateEnums::MODULE_LIBRARY &&
      (this->GetPolicyStatusCMP0073() == cmPolicies::OLD ||
       this->GetPolicyStatusCMP0073() == cmPolicies::WARN)) {
    std::string targetEntry = this->Name;
    targetEntry += "_LIB_DEPENDS";
    std::string dependencies;
    const char* old_val = mf.GetDefinition(targetEntry);
    if (old_val) {
      dependencies += old_val;
    }
    switch (llt) {
      case GENERAL_LibraryType:
        dependencies += "general";
        break;
      case DEBUG_LibraryType:
        dependencies += "debug";
        break;
      case OPTIMIZED_LibraryType:
        dependencies += "optimized";
        break;
    }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition(targetEntry, dependencies.c_str(),
                          "Dependencies for the target", cmStateEnums::STATIC);
  }
}